

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gzsetparams(gzFile file,int level,int strategy)

{
  int iVar1;
  z_streamp strm;
  gz_statep state;
  int strategy_local;
  int level_local;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = -2;
  }
  else if (((file[1].have == 0x79b1) && (*(int *)((long)&file[4].pos + 4) == 0)) &&
          ((int)file[2].pos == 0)) {
    if ((level == (int)file[3].pos) && (strategy == *(int *)((long)&file[3].pos + 4))) {
      file_local._4_4_ = 0;
    }
    else {
      if ((int)file[4].pos != 0) {
        *(undefined4 *)&file[4].pos = 0;
        iVar1 = gz_zero((gz_statep)file,(long)file[4].next);
        if (iVar1 == -1) {
          return *(int *)((long)&file[4].pos + 4);
        }
      }
      if ((int)file[1].pos != 0) {
        if (((int)file[5].pos != 0) && (iVar1 = gz_comp((gz_statep)file,5), iVar1 == -1)) {
          return *(int *)((long)&file[4].pos + 4);
        }
        deflateParams((z_streamp)&file[5].next,level,strategy);
      }
      *(int *)&file[3].pos = level;
      *(int *)((long)&file[3].pos + 4) = strategy;
      file_local._4_4_ = 0;
    }
  }
  else {
    file_local._4_4_ = -2;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzsetparams(gzFile file, int level, int strategy) {
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK || state->direct)
        return Z_STREAM_ERROR;

    /* if no change is requested, then do nothing */
    if (level == state->level && strategy == state->strategy)
        return Z_OK;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* change compression parameters for subsequent input */
    if (state->size) {
        /* flush previous input with previous parameters before changing */
        if (strm->avail_in && gz_comp(state, Z_BLOCK) == -1)
            return state->err;
        deflateParams(strm, level, strategy);
    }
    state->level = level;
    state->strategy = strategy;
    return Z_OK;
}